

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall cmInstallCommand::CheckCMP0006(cmInstallCommand *this,bool *failure)

{
  cmMakefile *pcVar1;
  PolicyStatus PVar2;
  PolicyID id;
  string local_38;
  
  PVar2 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0006);
  if (PVar2 - REQUIRED_IF_USED < 2) {
    *failure = true;
    pcVar1 = (this->super_cmCommand).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_38,(cmPolicies *)0x6,id);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_38,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if (PVar2 == OLD) {
      return true;
    }
    if (PVar2 == WARN) {
      pcVar1 = (this->super_cmCommand).Makefile;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_38,(cmPolicies *)0x6,id);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_38,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p == &local_38.field_2) {
        return true;
      }
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      return true;
    }
  }
  return false;
}

Assistant:

bool cmInstallCommand::CheckCMP0006(bool& failure)
{
  switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0006))
    {
    case cmPolicies::WARN:
      {
      this->Makefile->IssueMessage(
        cmake::AUTHOR_WARNING,
        cmPolicies::GetPolicyWarning(cmPolicies::CMP0006)
        );
      }
    case cmPolicies::OLD:
      // OLD behavior is to allow compatibility
      return true;
    case cmPolicies::NEW:
      // NEW behavior is to disallow compatibility
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      failure = true;
      this->Makefile->IssueMessage(
        cmake::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0006)
        );
      break;
    }
  return false;
}